

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

Matrix * rlGetMatrixTransform(void)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix *in_RDI;
  
  uVar2 = RLGL.State.transform._56_8_;
  fVar1 = RLGL.State.transform.m7;
  in_RDI->m3 = RLGL.State.transform.m3;
  uVar3 = RLGL.State.transform._56_8_;
  in_RDI->m7 = fVar1;
  RLGL.State.transform.m11 = (float)uVar2;
  RLGL.State.transform.m15 = SUB84(uVar2,4);
  fVar1 = RLGL.State.transform.m15;
  in_RDI->m11 = RLGL.State.transform.m11;
  RLGL.State.transform._56_8_ = uVar3;
  uVar2 = RLGL.State.transform._40_8_;
  in_RDI->m15 = fVar1;
  fVar1 = RLGL.State.transform.m6;
  in_RDI->m2 = RLGL.State.transform.m2;
  uVar3 = RLGL.State.transform._40_8_;
  in_RDI->m6 = fVar1;
  RLGL.State.transform.m10 = (float)uVar2;
  RLGL.State.transform.m14 = SUB84(uVar2,4);
  fVar1 = RLGL.State.transform.m14;
  in_RDI->m10 = RLGL.State.transform.m10;
  RLGL.State.transform._40_8_ = uVar3;
  uVar2 = RLGL.State.transform._24_8_;
  in_RDI->m14 = fVar1;
  fVar1 = RLGL.State.transform.m5;
  in_RDI->m1 = RLGL.State.transform.m1;
  uVar3 = RLGL.State.transform._24_8_;
  in_RDI->m5 = fVar1;
  RLGL.State.transform.m9 = (float)uVar2;
  RLGL.State.transform.m13 = SUB84(uVar2,4);
  fVar1 = RLGL.State.transform.m13;
  in_RDI->m9 = RLGL.State.transform.m9;
  RLGL.State.transform._24_8_ = uVar3;
  uVar2 = RLGL.State.transform._8_8_;
  in_RDI->m13 = fVar1;
  fVar1 = RLGL.State.transform.m4;
  in_RDI->m0 = RLGL.State.transform.m0;
  uVar3 = RLGL.State.transform._8_8_;
  in_RDI->m4 = fVar1;
  RLGL.State.transform.m8 = (float)uVar2;
  RLGL.State.transform.m12 = SUB84(uVar2,4);
  fVar1 = RLGL.State.transform.m12;
  in_RDI->m8 = RLGL.State.transform.m8;
  RLGL.State.transform._8_8_ = uVar3;
  in_RDI->m12 = fVar1;
  return in_RDI;
}

Assistant:

Matrix rlGetMatrixTransform(void)
{
    Matrix mat = rlMatrixIdentity();
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // TODO: Consider possible transform matrices in the RLGL.State.stack
    // Is this the right order? or should we start with the first stored matrix instead of the last one?
    //Matrix matStackTransform = rlMatrixIdentity();
    //for (int i = RLGL.State.stackCounter; i > 0; i--) matStackTransform = rlMatrixMultiply(RLGL.State.stack[i], matStackTransform);
    mat = RLGL.State.transform;
#endif
    return mat;
}